

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

int eatfood(void)

{
  int iVar1;
  boolean bVar2;
  uint uVar3;
  bool bVar4;
  
  if ((victual.piece != (obj *)0x0) &&
     (((victual.piece)->where == '\x03' ||
      (bVar2 = obj_here(victual.piece,(int)u.ux,(int)u.uy), bVar2 != '\0')))) {
    bVar4 = true;
    if (((youmonst.data)->mlet != '0') && (((youmonst.data)->mflags2 & 0x100) == 0)) {
      bVar4 = youmonst.data == mons + 0x85;
    }
    if (bVar4 == ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) != 0)) {
      if ((victual._20_1_ & 4) == 0) {
        return 0;
      }
      iVar1 = victual.usedtime + 1;
      if (victual.usedtime < victual.reqtime) {
        victual.usedtime = iVar1;
        uVar3 = bite();
        return uVar3 ^ 1;
      }
      uVar3 = (victual.piece)->oeaten;
      if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) != 0) {
        uVar3 = uVar3 - (int)(((ulong)mons[(victual.piece)->corpsenm].cnutrit << 2) / 5);
      }
      victual.usedtime = iVar1;
      if (0 < (int)uVar3) {
        lesshungry(uVar3);
        (victual.piece)->oeaten = (victual.piece)->oeaten - uVar3;
      }
      done_eating('\x01');
      return 0;
    }
  }
  do_reset_eat();
  return 0;
}

Assistant:

static int eatfood(void)	/* called each move during eating process */
{
	if (!victual.piece ||
	 (!carried(victual.piece) && !obj_here(victual.piece, u.ux, u.uy))) {
		/* maybe it was stolen? */
		do_reset_eat();
		return 0;
	}
	if (is_vampiric(youmonst.data) != victual.piece->odrained) {
	    /* polymorphed while eating/draining */
	    do_reset_eat();
	    return 0;
	}
	if (!victual.eating) return 0;

	if (++victual.usedtime <= victual.reqtime) {
	    if (bite()) return 0;
	    return 1;	/* still busy */
	} else {	/* done */
	    int crumbs = victual.piece->oeaten;	/* the last crumbs */
	    if (victual.piece->odrained)
		crumbs -= drainlevel(victual.piece);
	    if (crumbs > 0) {
		lesshungry(crumbs);
		victual.piece->oeaten -= crumbs;
	    }
	    done_eating(TRUE);
	    return 0;
	}
}